

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O2

Var JSON::Parse(JavascriptString *input,RecyclableObject *reviver,ScriptContext *scriptContext)

{
  bool bVar1;
  PropertyId propertyId;
  LazyJSONString *this;
  Var newValue;
  DynamicObject *instance;
  JavascriptString *name;
  undefined1 local_f0 [8];
  JSONParser parser;
  FinallyObject local_38;
  
  JSONParser::JSONParser((JSONParser *)local_f0,scriptContext,reviver);
  local_38.finallyFunc = (anon_class_48_6_9e8417c9 *)&parser.typeCacheList;
  local_38.abnormalTermination = true;
  parser.typeCacheList = (JsonTypeCacheList *)local_f0;
  bVar1 = Js::VarIsImpl<Js::LazyJSONString>(&input->super_RecyclableObject);
  if (bVar1) {
    this = Js::UnsafeVarTo<Js::LazyJSONString,Js::JavascriptString>(input);
    if (this != (LazyJSONString *)0x0) {
      newValue = Js::LazyJSONString::TryParse(this);
      if (newValue != (Var)0x0) goto LAB_00a3789d;
    }
  }
  newValue = JSONParser::Parse((JSONParser *)local_f0,input);
LAB_00a3789d:
  if (DAT_0143bfa4 == '\x01') {
    Memory::Recycler::CollectNow<(Memory::CollectionFlags)16384>(scriptContext->recycler);
  }
  if (reviver != (RecyclableObject *)0x0) {
    instance = Js::JavascriptLibrary::CreateObject
                         ((scriptContext->super_ScriptContextBase).javascriptLibrary,false,0);
    propertyId = Js::ScriptContext::GetEmptyStringPropertyId(scriptContext);
    Js::JavascriptOperators::InitProperty
              (&instance->super_RecyclableObject,propertyId,newValue,PropertyOperation_None);
    name = Js::JavascriptLibrary::GetEmptyString
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary);
    newValue = JSONParser::Walk((JSONParser *)local_f0,name,propertyId,instance,0xffffffff);
  }
  local_38.abnormalTermination = false;
  anon_func::FinallyObject::~FinallyObject(&local_38);
  return newValue;
}

Assistant:

Js::Var Parse(Js::JavascriptString* input, Js::RecyclableObject* reviver, Js::ScriptContext* scriptContext)
    {
        // alignment required because of the union in JSONParser::m_token
        __declspec (align(8)) JSONParser parser(scriptContext, reviver);
        Js::Var result = NULL;

        TryFinally([&]()
        {
            LazyJSONString* lazyString = JavascriptOperators::TryFromVar<LazyJSONString>(input);
            if (lazyString)
            {
                // Try to reconstruct object based on the data collected during stringify
                // In case of semantically important gap, this call may fail and we will need to do real parse
                result = lazyString->TryParse();
            }
            if (result == nullptr)
            {
                result = parser.Parse(input);
            }

    #ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            if (CONFIG_FLAG(ForceGCAfterJSONParse))
            {
                Recycler* recycler = scriptContext->GetRecycler();
                recycler->CollectNow<CollectNowForceInThread>();
            }
    #endif

            if (reviver)
            {
                Js::DynamicObject* root = scriptContext->GetLibrary()->CreateObject();
                JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(root));
                Js::PropertyId propertyId = scriptContext->GetEmptyStringPropertyId();
                Js::JavascriptOperators::InitProperty(root, propertyId, result);
                result = parser.Walk(scriptContext->GetLibrary()->GetEmptyString(), propertyId, root);
            }
        },
            [&](bool/*hasException*/)
        {
            parser.Finalizer();
        });

        return result;
    }